

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::Matchers::Floating::WithinUlpsMatcher::match(WithinUlpsMatcher *this,double *matchee)

{
  char cVar1;
  string *msg;
  long in_RDI;
  ReusableStringStream *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  uint64_t in_stack_ffffffffffffff68;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  undefined3 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  SourceLineInfo local_60 [5];
  bool local_1;
  
  cVar1 = *(char *)(in_RDI + 0x40);
  if (cVar1 == '\0') {
    local_1 = anon_unknown_1::almostEqualUlps<float>
                        (SUB84(in_stack_ffffffffffffff70,0),
                         (float)(in_stack_ffffffffffffff68 >> 0x20),
                         (uint64_t)in_stack_ffffffffffffff60);
  }
  else {
    if (cVar1 != '\x01') {
      ReusableStringStream::ReusableStringStream
                ((ReusableStringStream *)
                 CONCAT44(in_stack_ffffffffffffff94,CONCAT13(cVar1,in_stack_ffffffffffffff90)));
      SourceLineInfo::SourceLineInfo
                (local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/catch.hpp"
                 ,0x2d54);
      msg = (string *)
            ReusableStringStream::operator<<
                      (in_stack_ffffffffffffff60,(SourceLineInfo *)in_stack_ffffffffffffff58);
      ReusableStringStream::operator<<
                (in_stack_ffffffffffffff60,(char (*) [26])in_stack_ffffffffffffff58);
      ReusableStringStream::operator<<
                (in_stack_ffffffffffffff60,(char (*) [32])in_stack_ffffffffffffff58);
      ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff58);
      throw_logic_error(msg);
    }
    local_1 = anon_unknown_1::almostEqualUlps<double>
                        (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68);
  }
  return local_1;
}

Assistant:

bool WithinUlpsMatcher::match(double const& matchee) const {
        switch (m_type) {
        case FloatingPointKind::Float:
            return almostEqualUlps<float>(static_cast<float>(matchee), static_cast<float>(m_target), m_ulps);
        case FloatingPointKind::Double:
            return almostEqualUlps<double>(matchee, m_target, m_ulps);
        default:
            CATCH_INTERNAL_ERROR( "Unknown FloatingPointKind value" );
        }
    }